

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::SwitchStmt::SwitchStmt(SwitchStmt *this,Var *target)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  uint32_t width;
  int iVar3;
  StmtException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  SwitchStmt *local_78;
  Var *local_70;
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  
  Stmt::Stmt(&this->super_Stmt,Switch);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b4130;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&this->target_,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &target->super_enable_shared_from_this<kratos::Var>);
  (this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = &(this->body_)._M_t._M_impl.super__Rb_tree_header;
  (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->body_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (target->type_ != ConstValue) {
    width = (*(target->super_IRNode)._vptr_IRNode[0xd])(target);
    iVar3 = (*(target->super_IRNode)._vptr_IRNode[7])(target);
    Generator::get_auxiliary_var((Generator *)local_48,width,SUB41(iVar3,0));
    Var::assign((Var *)local_68,(Var *)local_48._0_8_);
    std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->target_stmt_).
                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    peVar2 = (this->target_stmt_).super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar2,this);
    return;
  }
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  local_48._0_8_ = (target->name)._M_dataplus._M_p;
  local_48._8_8_ = (target->name)._M_string_length;
  bVar4 = fmt::v7::to_string_view<char,_0>("switch target cannot be const value {0}");
  format_str.data_ = (char *)bVar4.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_48;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_68,(detail *)bVar4.data_,format_str,args);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_78;
  local_78 = this;
  local_70 = target;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_48,__l,
             (allocator_type *)(local_48 + 0x1f));
  StmtException::StmtException
            (this_00,(string *)local_68,
             (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_48);
  __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SwitchStmt::SwitchStmt(Var &target)
    : Stmt(StatementType::Switch), target_(target.shared_from_this()) {
    // we don't allow const target
    if (target.type() == VarType::ConstValue)
        throw StmtException(::format("switch target cannot be const value {0}", target.name),
                            {this, &target});

    // just to add the sinks
    target_stmt_ = target.generator()->get_auxiliary_var(target.width())->assign(target);
    target_stmt_->set_parent(this);
}